

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::setProperty(TimeCoordinator *this,int timeProperty,Time propertyVal)

{
  bool bVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  
  switch(in_ESI) {
  case 0x89:
    *(undefined8 *)(in_RDI + 0x228) = in_RDX;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x228),
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar1) {
      *(undefined8 *)(in_RDI + 0x228) = 1;
    }
    break;
  default:
    break;
  case 0x8c:
    *(undefined8 *)(in_RDI + 0x248) = in_RDX;
    break;
  case 0x8d:
    *(undefined8 *)(in_RDI + 0x240) = in_RDX;
    break;
  case 0x94:
    *(undefined8 *)(in_RDI + 0x230) = in_RDX;
    break;
  case 0x96:
    *(undefined8 *)(in_RDI + 0x238) = in_RDX;
  }
  return;
}

Assistant:

void TimeCoordinator::setProperty(int timeProperty, Time propertyVal)
{
    switch (timeProperty) {
        case defs::Properties::OUTPUT_DELAY:
            info.outputDelay = propertyVal;
            break;
        case defs::Properties::INPUT_DELAY:
            info.inputDelay = propertyVal;
            break;
        case defs::Properties::TIME_DELTA:
            info.timeDelta = propertyVal;
            if (info.timeDelta <= timeZero) {
                info.timeDelta = timeEpsilon;
            }
            break;
        case defs::Properties::PERIOD:
            info.period = propertyVal;
            break;
        case defs::Properties::OFFSET:
            info.offset = propertyVal;
            break;
        default:
            break;
    }
}